

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

bool __thiscall
ON_OutlineFigure::IsInsideOf
          (ON_OutlineFigure *this,ON_OutlineFigure *outer_figure,bool bPerformExtraChecking)

{
  double *pdVar1;
  ON_2dPoint *pOVar2;
  Orientation OVar3;
  bool bVar4;
  Orientation OVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint i;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar13;
  double dVar14;
  double dVar15;
  ON_SimpleArray<ON_2dPoint> outer_pline;
  ON_SimpleArray<ON_2dPoint> inner_pline;
  ON_2fPoint this_p [4];
  ON_BoundingBox outer_bbox;
  ON_BoundingBox this_bbox;
  double local_1b0;
  double local_1a8;
  ON_2dPoint local_198;
  ON_2dPoint local_188;
  double local_178;
  double local_170;
  ON_2dPoint *local_168;
  double local_160;
  ON_SimpleArray<ON_2dPoint> local_158;
  ON_SimpleArray<ON_2dPoint> local_140;
  undefined1 local_128 [16];
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  ulong local_f0;
  ON_2dPoint local_e8;
  ON_2dPoint local_d8;
  double local_c8;
  undefined8 uStack_c0;
  ON_2fPoint local_b8 [5];
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  if ((outer_figure != (ON_OutlineFigure *)0x0) &&
     (OVar3 = FigureOrientation(outer_figure), 0xfd < (byte)(OVar3 - NotOriented))) {
    BoundingBox(&local_60,this);
    BoundingBox(&local_90,outer_figure);
    bVar4 = ON_BoundingBox::Includes(&local_90,&local_60,false);
    if (!bVar4) {
      return false;
    }
    dVar13 = AreaEstimate(outer_figure);
    local_128._8_4_ = extraout_XMM0_Dc;
    local_128._0_8_ = dVar13;
    local_128._12_4_ = extraout_XMM0_Dd;
    dVar13 = AreaEstimate(this);
    if (dVar13 == 0.0) {
      return false;
    }
    if (ABS((double)local_128._0_8_) <= ABS(dVar13)) {
      return false;
    }
    uVar7 = GetUpToFourPointsOnFigure(this,local_b8);
    if (uVar7 != 0) {
      uVar11 = 0;
      do {
        iVar8 = WindingNumber(outer_figure,local_b8[uVar11]);
        iVar10 = -iVar8;
        if (OVar3 == CounterClockwise) {
          iVar10 = iVar8;
        }
        if (iVar10 != 1) {
          return false;
        }
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
      if (uVar7 != 0) {
        OVar5 = FigureOrientation(this);
        if (OVar3 != OVar5 && !bPerformExtraChecking) {
          return true;
        }
        local_158._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080b170;
        local_158.m_a = (ON_2dPoint *)0x0;
        local_158.m_count = 0;
        local_158.m_capacity = 0;
        GetPolyline(outer_figure,0.0,&local_158);
        local_f0 = local_158._16_8_ & 0xffffffff;
        if (3 < local_f0) {
          local_140._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080b170;
          local_140.m_a = (ON_2dPoint *)0x0;
          local_140.m_count = 0;
          local_140.m_capacity = 0;
          GetPolyline(this,0.0,&local_140);
          pOVar2 = local_140.m_a;
          if (1 < (local_140._16_8_ & 0xffffffff)) {
            local_168 = local_158.m_a;
            local_f8 = (local_140.m_a)->x;
            local_108 = (local_140.m_a)->y;
            lVar12 = (local_140._16_8_ & 0xffffffff) << 4;
            lVar9 = 0x10;
            local_1b0 = local_108;
            local_1a8 = local_f8;
            do {
              dVar13 = *(double *)((long)&(local_140.m_a)->x + lVar9);
              dVar14 = dVar13;
              if ((local_1a8 <= dVar13) && (dVar14 = local_1a8, local_f8 < dVar13)) {
                local_f8 = dVar13;
              }
              local_1a8 = dVar14;
              dVar13 = *(double *)((long)&(local_140.m_a)->y + lVar9);
              dVar14 = dVar13;
              if ((local_1b0 <= dVar13) && (dVar14 = local_1b0, local_108 < dVar13)) {
                local_108 = dVar13;
              }
              local_1b0 = dVar14;
              lVar9 = lVar9 + 0x10;
            } while (lVar12 != lVar9);
            local_188.x = (local_158.m_a)->x;
            local_188.y = (local_158.m_a)->y;
            local_e8.x = ON_2dPoint::NanPoint.x;
            local_e8.y = ON_2dPoint::NanPoint.y;
            local_d8.x = ON_2dPoint::NanPoint.x;
            local_d8.y = ON_2dPoint::NanPoint.y;
            uVar11 = 1;
            bVar4 = false;
            local_170 = ON_DBL_QNAN;
            local_110 = ON_DBL_QNAN;
            local_178 = ON_DBL_QNAN;
            do {
              local_198.x = local_188.x;
              local_198.y = local_188.y;
              local_188.x = local_168[uVar11].x;
              local_188.y = local_168[uVar11].y;
              bVar6 = ON_2dPoint::operator==(&local_198,&local_188);
              if (!bVar6) {
                local_160 = local_198.x;
                if (local_198.x <= local_188.x) {
                  local_160 = local_188.x;
                }
                if ((local_1a8 <= local_160) &&
                   (dVar13 = (double)(~-(ulong)(local_188.x < local_198.x) & (ulong)local_198.x |
                                     (ulong)local_188.x & -(ulong)(local_188.x < local_198.x)),
                   dVar13 <= local_f8)) {
                  local_128._8_8_ = 0;
                  local_128._0_8_ = dVar13;
                  dVar13 = local_198.y;
                  if (local_198.y <= local_188.y) {
                    dVar13 = local_188.y;
                  }
                  if ((local_1b0 <= dVar13) &&
                     (dVar14 = (double)(~-(ulong)(local_188.y < local_198.y) & (ulong)local_198.y |
                                       (ulong)local_188.y & -(ulong)(local_188.y < local_198.y)),
                     dVar14 <= local_108)) {
                    uStack_c0 = 0;
                    local_d8.x = pOVar2->x;
                    local_d8.y = pOVar2->y;
                    lVar9 = 0x10;
                    dVar15 = local_110;
                    local_100 = dVar13;
                    local_c8 = dVar14;
                    do {
                      local_e8.x = local_d8.x;
                      local_e8.y = local_d8.y;
                      pdVar1 = (double *)((long)&pOVar2->x + lVar9);
                      local_d8.x = *pdVar1;
                      local_d8.y = pdVar1[1];
                      bVar6 = ON_2dPoint::operator==(&local_e8,&local_d8);
                      if ((((!bVar6) &&
                           (((double)local_128._0_8_ <= local_e8.x ||
                            ((double)local_128._0_8_ <= local_d8.x)))) &&
                          ((local_c8 <= local_e8.y || (local_c8 <= local_d8.y)))) &&
                         (((local_e8.x <= local_160 || (local_d8.x <= local_160)) &&
                          ((local_e8.y <= local_100 || (local_d8.y <= local_100)))))) {
                        if (NAN(dVar15)) {
                          dVar15 = local_188.y - local_198.y;
                          local_170 = local_198.x - local_188.x;
                          local_178 = local_188.x * local_198.y - local_188.y * local_198.x;
                        }
                        dVar13 = dVar15 * local_e8.x + local_e8.y * local_170 + local_178;
                        dVar14 = dVar15 * local_d8.x + local_d8.y * local_170 + local_178;
                        if (((0.0 <= dVar13) || (0.0 <= dVar14)) &&
                           ((dVar13 <= 0.0 || (dVar14 <= 0.0)))) {
                          dVar13 = local_d8.x * local_e8.y + local_d8.y * -local_e8.x;
                          dVar14 = (local_d8.y - local_e8.y) * local_e8.x +
                                   (local_e8.x - local_d8.x) * local_e8.y + dVar13;
                          dVar13 = dVar13 + local_d8.x * (local_d8.y - local_e8.y) +
                                            local_d8.y * (local_e8.x - local_d8.x);
                          if (((0.0 <= dVar14) || (0.0 <= dVar13)) &&
                             ((dVar14 <= 0.0 || (dVar13 <= 0.0)))) {
                            ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_140);
                            ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_158);
                            if (bVar4) {
                              return true;
                            }
                            return false;
                          }
                        }
                      }
                      lVar9 = lVar9 + 0x10;
                    } while (lVar12 != lVar9);
                  }
                }
              }
              uVar11 = uVar11 + 1;
              bVar4 = local_f0 <= uVar11;
              if (uVar11 == local_f0) {
                ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_140);
                ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_158);
                return true;
              }
            } while( true );
          }
          ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_140);
        }
        ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&local_158);
      }
    }
  }
  return false;
}

Assistant:

bool ON_OutlineFigure::IsInsideOf(
  const ON_OutlineFigure* outer_figure,
  bool bPerformExtraChecking
) const
{
  if (nullptr == outer_figure)
    return false;

  const ON_OutlineFigure::Orientation outer_orientation = outer_figure->FigureOrientation();
  if (ON_OutlineFigure::Orientation::Clockwise != outer_orientation && ON_OutlineFigure::Orientation::CounterClockwise != outer_orientation)
    return false;


  const ON_BoundingBox this_bbox = this->BoundingBox();
  const ON_BoundingBox outer_bbox = outer_figure->BoundingBox();
  if (false == outer_bbox.Includes(this_bbox))
  {
    // The bounding boxes are from the glyph outline control polygons.
    // There are rare case when this f is inside of other_f
    // but this_bbox is not contained in other_bbox. In practice, this
    // is quite rare, but that's why "probably" is part of this function's name.
    return false;
  }

  const double outer_area = fabs(outer_figure->AreaEstimate());
  const double this_area = fabs(this->AreaEstimate());
  if (false == (0.0 < this_area && this_area < outer_area))
    return false; // this figure is too big to be inside of other_f

  // Check that the 3 standard test points on this are inside of other_f.
  // Again, it is possible that the 3 test points are inside but some other
  // point is outside. In practice this is rare and that possibility
  // is why "probably" is in this function's name.

  const int outer_orientation_sign = ON_OutlineFigure::Orientation::CounterClockwise == outer_orientation ? 1 : -1;

  ON_2fPoint this_p[4];
  unsigned  this_point_count = this->GetUpToFourPointsOnFigure(this_p);

  for (unsigned i = 0; i < this_point_count; ++i)
  {
    // check start point.
    const int wn = outer_orientation_sign * outer_figure->WindingNumber(this_p[i]);
    if (1 != wn)
    {
      // this_p[i] is not inside of other_f.
      return false;
    }
  }

  if (0 == this_point_count)
    return false;

  const ON_OutlineFigure::Orientation this_orientation = this->FigureOrientation();

  if (outer_orientation == this_orientation || bPerformExtraChecking)
  {
    // The context that calls this function is sorting nested loops.
    // The orientation of outer_figure has been decided and set at this point.
    // When this orientation of this is not different, we need more checking
    // to verify that the orientation from the font definition file was really "wrong".
    // The "A crossbar" in Bahnschrift U+00C5 is one of many cases that
    // require this additional checking. More generally, glyphs with
    // orientations set correctly and which use overlapping outer 
    // boundaries need this test to prevent incorrectly. This situation is
    // common in fonts like Bahnschrift and fonts for Asian language scripts
    // that have "brush stroke" boundaries that overlap.
    if (false == Internal_ExtraInsideOfPolylineText(outer_figure, this))
      return false;
  }

  return true;
}